

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::isPageSizesMultiplication
          (SparseTextureCommitmentTestCase *this,GLint target,GLint level)

{
  bool bVar1;
  GLint depth;
  GLint height;
  GLint width;
  int local_1c;
  int local_18;
  int local_14;
  
  SparseTextureUtils::getTextureLevelSize(target,&this->mState,level,&local_14,&local_18,&local_1c);
  if (target == 0x8513) {
    local_1c = local_1c * 6;
  }
  if ((((int)(CONCAT44(local_14 - (local_14 >> 0x1f) >> 0x1f,local_14 / 2) %
             (long)(this->mState).pageSizeX) == 0) && (local_18 % (this->mState).pageSizeY == 0)) &&
     (local_1c % (this->mState).pageSizeZ == 0)) {
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SparseTextureCommitmentTestCase::isPageSizesMultiplication(GLint target, GLint level)
{
	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = 6 * depth;

	GLint widthCommitted = width / 2;
	if ((widthCommitted % mState.pageSizeX) == 0 && (height % mState.pageSizeY) == 0 && (depth % mState.pageSizeZ) == 0)
	{
		return true;
	}

	return false;
}